

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.h
# Opt level: O0

void __thiscall basist::ktx2_transcoder_state::clear(ktx2_transcoder_state *this)

{
  basisu_transcoder_state *in_RDI;
  
  basisu_transcoder_state::clear(in_RDI);
  basisu::vector<unsigned_char>::clear((vector<unsigned_char> *)in_RDI);
  *(undefined4 *)&in_RDI[1].m_block_endpoint_preds[1].m_p = 0xffffffff;
  return;
}

Assistant:

void clear()
		{
			m_transcoder_state.clear();
			m_level_uncomp_data.clear();
			m_uncomp_data_level_index = -1;
		}